

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O1

void nn_sinproc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  
  if (self->state == 3) {
    if (src != 0x6c41) {
      if (src != -2) goto LAB_001a645d;
      if (type == 5) goto LAB_001a6482;
      if (type != -3) goto LAB_001a645d;
      if ((*(uint *)&self[1].fn | 4) == 5) {
        *(undefined4 *)&self[1].fn = 7;
        goto LAB_001a6482;
      }
      nn_pipebase_stop((nn_pipebase *)&self[1].state);
      if (0xfffffffd < self->state - 4U) {
        nn_fsm_raiseto(self,(nn_fsm *)self[1].shutdown_fn,
                       (nn_fsm_event *)&((nn_fsm *)self[1].shutdown_fn)[6].stopped.type,0x6c41,6,
                       self);
        *(undefined4 *)&self[1].fn = 6;
        goto LAB_001a6482;
      }
      goto LAB_001a6528;
    }
    if (type == 5) goto LAB_001a6482;
LAB_001a645d:
    if (*(int *)&self[1].fn == 6) {
      if (src != 0x6c41) goto LAB_001a6532;
      if (type == 6) {
        *(undefined4 *)&self[1].fn = 7;
      }
LAB_001a6482:
      if (*(int *)&self[1].fn != 7) {
        return;
      }
      iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[6].owner);
      if (iVar1 != 0) {
        return;
      }
      iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[6].stopped.type);
      if (iVar1 != 0) {
        return;
      }
      iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[5].ctx);
      if (iVar1 != 0) goto LAB_001a651e;
      iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[5].stopped.item);
      if (iVar1 == 0) {
        nn_fsm_stopped(self,7);
        return;
      }
      goto LAB_001a6523;
    }
  }
  else {
    nn_sinproc_shutdown_cold_1();
LAB_001a651e:
    nn_sinproc_shutdown_cold_5();
LAB_001a6523:
    nn_sinproc_shutdown_cold_6();
LAB_001a6528:
    nn_sinproc_shutdown_cold_2();
  }
  nn_sinproc_shutdown_cold_3();
LAB_001a6532:
  nn_sinproc_shutdown_cold_4();
}

Assistant:

static void nn_sinproc_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sinproc *sinproc;

    sinproc = nn_cont (self, struct nn_sinproc, fsm);
    nn_assert (sinproc->fsm.state == 3);

    nn_sinproc_shutdown_events (sinproc, src, type, srcptr);

    /*  ***************  */
    /*  States to check  */
    /*  ***************  */

    /*  Have we got notification that peer is stopped  */
    if (nn_slow (sinproc->state != NN_SINPROC_STATE_STOPPING)) {
        return;
    }

    /*  Are all events processed? We can't cancel them unfortunately  */
    if (nn_fsm_event_active (&sinproc->event_received)
        || nn_fsm_event_active (&sinproc->event_disconnect))
    {
        return;
    }
    /*  These events are deemed to be impossible here  */
    nn_assert (!nn_fsm_event_active (&sinproc->event_connect));
    nn_assert (!nn_fsm_event_active (&sinproc->event_sent));

    /*  **********************************************  */
    /*  All checks are successful. Just stop right now  */
    /*  **********************************************  */

    nn_fsm_stopped (&sinproc->fsm, NN_SINPROC_STOPPED);
    return;
}